

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTimeAccess.cpp
# Opt level: O0

long __thiscall bhf::ads::RTimeAccess::SetSharedCores(RTimeAccess *this,uint32_t sharedCores)

{
  uint32_t uVar1;
  uint uVar2;
  long port;
  RTimeAccess *pRVar3;
  AmsAddr local_48;
  AmsAddr systemService;
  RTimeCpuSettings oldSettings;
  uint32_t sharedCores_local;
  RTimeAccess *this_local;
  
  oldSettings.nCpuFreq = sharedCores;
  ReadCpuSettings((RTimeCpuSettings *)&systemService,this);
  uVar1 = oldSettings.nCpuFreq;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (uVar1 == uVar2) {
    if (systemService._4_4_ == 0) {
      std::operator<<((ostream *)&std::cout,
                      "Requested shared core configuration already active, no change applied.\n");
      return (long)(RTimeAccess *)0x70f;
    }
  }
  else if (oldSettings.nCpuFreq == systemService.netId.b._0_4_) {
    std::operator<<((ostream *)&std::cout,
                    "Requested shared core configuration already active, no change applied.\n");
    return (long)(RTimeAccess *)0x70f;
  }
  local_48.netId.b._0_4_ = *(undefined4 *)(this->device).m_Addr.netId.b;
  local_48.netId.b._4_2_ = *(undefined2 *)((this->device).m_Addr.netId.b + 4);
  local_48.port = 10000;
  port = AdsDevice::GetLocalPort(&this->device);
  pRVar3 = (RTimeAccess *)AdsSyncWriteReqEx(port,&local_48,0x4b0,0,4,&oldSettings.nCpuFreq);
  return (long)pRVar3;
}

Assistant:

long RTimeAccess::SetSharedCores(const uint32_t sharedCores) const
{
    const auto oldSettings = ReadCpuSettings();

    if (sharedCores == std::numeric_limits<uint32_t>::max()) {
        // 0xffffffff means RESET -> no isolated cores, all shared.
        if (0 == oldSettings.nNonWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    } else {
        // All other values mean limit the number of shared cores -> use remaining cores as isolated.
        if (sharedCores == oldSettings.nWinCPUs) {
            std::cout << "Requested shared core configuration already active, no change applied.\n";
            return ADSERR_DEVICE_EXISTS;
        }
    }
    // We have to apply changes to the current core configuration. For this we
    // have to talk to a different AdsDevice, the system service. Now, it is handy
    // that ADS doesn't really implement "connections" so we can just use the AMS
    // port of our RTimeAccess object, but adust the target AmsPort.
    const AmsAddr systemService { device.m_Addr.netId, 10000 };
    return AdsSyncWriteReqEx(device.GetLocalPort(),
                             &systemService,
                             SYSTEMSERVICE_SETNUMPROC,
                             0,
                             sizeof(sharedCores),
                             &sharedCores);
}